

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

void __thiscall
Refal2::CInternalProgramBuilder::processModules
          (CInternalProgramBuilder *this,CModuleDataVector *modules,
          TProcessFunctionPtr processFunction)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  pointer pCVar3;
  unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>
  *this_01;
  pointer pCVar4;
  long in_RCX;
  long *plVar5;
  code *local_88;
  int local_5c;
  int i;
  CPreparatoryFunctions *functions;
  __normal_iterator<const_std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_*,_std::vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>_>
  local_48;
  const_iterator module;
  TRuntimeModuleId currentModuleId;
  TProcessFunctionPtr processFunction_local;
  CModuleDataVector *modules_local;
  CInternalProgramBuilder *this_local;
  
  module._M_current._4_4_ = 0;
  local_48._M_current =
       (unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_> *)
       std::
       vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
       ::begin(modules);
  while( true ) {
    functions = (CPreparatoryFunctions *)
                std::
                vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                ::end(modules);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_*,_std::vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>_>
                        *)&functions);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_*,_std::vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>_>
              ::operator*(&local_48);
    pCVar3 = std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>::
             operator->(this_00);
    for (local_5c = 0;
        iVar2 = CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Size(&pCVar3->Functions), local_5c < iVar2; local_5c = local_5c + 1) {
      plVar5 = (long *)((long)&this->errors + in_RCX);
      local_88 = (code *)processFunction;
      if ((processFunction & 1) != 0) {
        local_88 = *(code **)(*plVar5 + (processFunction - 1));
      }
      this_01 = CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::GetData(&pCVar3->Functions,local_5c);
      pCVar4 = std::
               unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>
               ::get(this_01);
      (*local_88)(plVar5,pCVar4,module._M_current._4_4_);
    }
    module._M_current._4_4_ = module._M_current._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_*,_std::vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

void CInternalProgramBuilder::processModules( const CModuleDataVector& modules,
	const TProcessFunctionPtr processFunction )
{
	TRuntimeModuleId currentModuleId = 0;
	for( CModuleDataVector::const_iterator module = modules.begin();
		module != modules.end(); ++module )
	{
		const CPreparatoryFunctions& functions = ( *module )->Functions;
		for( int i = 0; i < functions.Size(); i++ ) {
			( this->*processFunction )( functions.GetData( i ).get(),
				currentModuleId );
		}
		currentModuleId++;
	}
}